

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Trait.cpp
# Opt level: O1

string * MeshLib::Trait::getTraitValue
                   (string *__return_storage_ptr__,string *traitString,string *traitName)

{
  pointer pcVar1;
  int iVar2;
  int iVar3;
  long *plVar4;
  ostream *poVar5;
  long *plVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::operator+(&local_50," ",traitName);
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
  plVar6 = plVar4 + 2;
  if ((long *)*plVar4 == plVar6) {
    local_60 = *plVar6;
    lStack_58 = plVar4[3];
    local_70 = &local_60;
  }
  else {
    local_60 = *plVar6;
    local_70 = (long *)*plVar4;
  }
  local_68 = plVar4[1];
  *plVar4 = (long)plVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  iVar2 = std::__cxx11::string::find((char *)traitString,(ulong)local_70,0);
  if (local_70 != &local_60) {
    operator_delete(local_70);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  pcVar1 = (traitName->_M_dataplus)._M_p;
  local_70 = &local_60;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar1,pcVar1 + traitName->_M_string_length);
  std::__cxx11::string::append((char *)&local_70);
  iVar3 = std::__cxx11::string::find((char *)traitString,(ulong)local_70,0);
  if (local_70 != &local_60) {
    operator_delete(local_70);
  }
  if (iVar2 == -1 && iVar3 != 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    std::__cxx11::string::substr((ulong)&local_70,(ulong)traitString);
    iVar2 = std::__cxx11::string::find_first_of((char *)&local_70,0x115310,0);
    std::__cxx11::string::find_first_of((char *)&local_70,0x1152c4,0);
    if (iVar2 == -1) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"ERROR: String missing parenthesis: ",0x23);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,(char *)local_70,local_68);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      std::ostream::put((char)poVar5);
      std::ostream::flush();
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      __return_storage_ptr__->_M_string_length = 0;
      (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    }
    else {
      std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)&local_70);
    }
    if (local_70 != &local_60) {
      operator_delete(local_70);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Trait::getTraitValue(std::string &traitString, std::string &traitName)
{
	int sp, ep, sfp;
	sfp = (int)traitString.find(" "+traitName+"=(");
	sp = (int)traitString.find(traitName+"=(");
	if(sp == 0 || sfp != (int)std::string::npos)
	{
		int temp;
		if( sp == 0 ) temp = sp;
		else temp = sfp;

		std::string isolatedTraitString(traitString.substr(temp));
		sp = (int)isolatedTraitString.find_first_of("(");
		ep = (int)isolatedTraitString.find_first_of(")");
		if(sp != (int)std::string::npos)
		{
			// the value was found
			sp++;
			return isolatedTraitString.substr(sp, ep-sp);
		}
		else
		{
			std::cerr << "ERROR: String missing parenthesis: " << isolatedTraitString << std::endl;
			return std::string();
		}
	}

	return std::string();
}